

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conv2dTest.c
# Opt level: O3

void main(void)

{
  size_t sVar1;
  byte bVar2;
  int iVar3;
  int iVar4;
  long M;
  long lVar5;
  float *data;
  float *data_00;
  FILE *__s;
  size_t __nmemb;
  long lVar6;
  long lVar7;
  long lVar8;
  char *__s_00;
  long dataSize;
  long kernSize2;
  long kernSize;
  long dataSize2;
  long local_68;
  long local_60;
  long local_58;
  long local_50;
  long local_48;
  long local_40;
  long local_38;
  
  local_58 = 0x35;
  local_60 = 0x1d;
  local_68 = 0xcc;
  local_38 = 0x24;
  printf(" %zu  Byte Floats \n",4);
  printf(" randseed = %10u\n",0x309);
  srand(0x309);
  M = lround(8.0);
  bVar2 = (byte)M;
  lVar7 = 1L << (bVar2 & 0x3f);
  lVar5 = lround(5.999999999999999);
  lVar6 = 1L << ((byte)lVar5 & 0x3f);
  printf("fft size = %6ld X%6ld,  ",lVar6,lVar7);
  iVar3 = fft2dInit(lVar5,M);
  __nmemb = lVar6 << (bVar2 & 0x3f);
  data = (float *)calloc(__nmemb,4);
  iVar4 = 2;
  if (data != (float *)0x0) {
    iVar4 = iVar3;
  }
  __s_00 = " out of memory ";
  if (iVar4 != 2) {
    if (iVar4 == 0) {
      data_00 = (float *)calloc(__nmemb,4);
      if (data_00 == (float *)0x0) goto LAB_00101541;
      __s = fopen("conv2ddat.c2d","wb");
      if (__s != (FILE *)0x0) {
        local_50 = lVar5;
        local_48 = lVar7;
        local_40 = lVar6;
        fwrite(&local_68,8,1,__s);
        fwrite(&local_38,8,1,__s);
        fwrite(&local_58,8,1,__s);
        fwrite(&local_60,8,1,__s);
        lVar6 = local_38;
        lVar5 = local_68;
        if (0 < local_38) {
          sVar1 = local_68 * 4;
          lVar7 = 0;
          do {
            if (0 < lVar5) {
              lVar8 = 0;
              do {
                iVar4 = rand();
                (data + (lVar7 << (bVar2 & 0x3f)))[lVar8] = (float)iVar4 * 9.313226e-10 + -1.0;
                lVar8 = lVar8 + 1;
              } while (lVar5 != lVar8);
            }
            fwrite(data + (lVar7 << (bVar2 & 0x3f)),sVar1,1,__s);
            lVar7 = lVar7 + 1;
          } while (lVar7 != lVar6);
        }
        lVar6 = local_58;
        lVar5 = local_60;
        if (0 < local_60) {
          sVar1 = local_58 * 4;
          lVar7 = 0;
          do {
            if (0 < lVar6) {
              lVar8 = 0;
              do {
                iVar4 = rand();
                (data_00 + (lVar7 << (bVar2 & 0x3f)))[lVar8] = (float)iVar4 * 9.313226e-10 + -1.0;
                lVar8 = lVar8 + 1;
              } while (lVar6 != lVar8);
            }
            fwrite(data_00 + (lVar7 << (bVar2 & 0x3f)),sVar1,1,__s);
            lVar7 = lVar7 + 1;
          } while (lVar7 != lVar5);
        }
        lVar5 = local_50;
        rfft2d(data,local_50,M);
        rfft2d(data_00,lVar5,M);
        rspect2dprod(data,data_00,data,local_40,local_48);
        rifft2d(data,lVar5,M);
        fwrite(data,__nmemb << 2,1,__s);
        fclose(__s);
        free(data_00);
        free(data);
        goto LAB_00101549;
      }
    }
    __s_00 = " error ";
  }
LAB_00101541:
  puts(__s_00);
LAB_00101549:
  fft2dFree();
  puts(" Done. ");
  return;
}

Assistant:

void main(){
long 	N = 256;	/* the number of cols in 2d ffts, must be power of 2 */
long 	N2 = 64;	/* the number of rows in 2d ffts, must be power of 2 */
long 	kernSize = 53;	/* kernal cols must be less than N */
long 	kernSize2 = 29;	/* kernal rows must be less than N2*/
long 	dataSize = N-kernSize+1;	/* data cols */
long 	dataSize2 = N2-kernSize2+1;	/* data rows */
float	*a;
float	*b;
long 	i1;
long 	i2;
long 	TheErr;
long		M;
long		M2;

FILE *fdataout;				/* output file */

unsigned int	randseed = 777;
int		rannum;
#if macintosh
	UnsignedWide 		TheTime1;
	Microseconds(&TheTime1);
	randseed = TheTime1.lo;
#endif

printf(" %zu  Byte Floats \n", sizeof(a[0]));
printf(" randseed = %10u\n", randseed);

srand(randseed);
M = lround(LOG2(N));
N = POW2(M);
M2 = lround(LOG2(N2));
N2 = POW2(M2);

printf("fft size = %6ld X%6ld,  ", N2, N);

if ((dataSize <= 0)||(dataSize2 <= 0)) TheErr = 22;
else TheErr = 0;

if(!TheErr){
	TheErr = fft2dInit(M2, M);
}

a = (float *) calloc(N2*N,sizeof(float) );	// calloc to zero pad data to fill N to N2
if (a == 0) TheErr = 2;
if(!TheErr){
	b = (float *) calloc(N2*N,sizeof(float) );	// calloc to zero pad data to fill N to N2
	if (b == 0) TheErr = 2;
}
if(!TheErr){
	fdataout = fopen("conv2ddat.c2d", "wb");
	if (fdataout == NULL) TheErr = -50;
}
if(!TheErr){

		/*  write sizes to fdataout */
	fwrite(&dataSize, sizeof(dataSize), 1, fdataout);
	fwrite(&dataSize2, sizeof(dataSize2), 1, fdataout);
	fwrite(&kernSize, sizeof(kernSize), 1, fdataout);
	fwrite(&kernSize2, sizeof(kernSize2), 1, fdataout);
		/*  set up a simple test case and write to fdataout */
	for (i2=0; i2<dataSize2; i2++){
		for (i1=0; i1<dataSize; i1++){
			rannum = rand();
			a[i2*N+i1] = BIPRAND(rannum);
		}
		fwrite(&a[i2*N], dataSize*sizeof(float), 1, fdataout);
	}
	for (i2=0; i2<kernSize2; i2++){
		for (i1=0; i1<kernSize; i1++){
			rannum = rand();
			b[i2*N+i1] = BIPRAND(rannum);
		}
		fwrite(&b[i2*N], kernSize*sizeof(float), 1, fdataout);
	}

	/* fast 2d convolution of zero padded sequences */
	rfft2d(a, M2, M);
	rfft2d(b, M2, M);
	rspect2dprod(a, b, a, N2, N);
	rifft2d(a, M2, M);

	/* write out answer */
	fwrite(a, N2*N*sizeof(float), 1, fdataout);

	fclose(fdataout);

	free(b);
	free(a);
	fft2dFree();
}
else{
	if(TheErr==2)	printf(" out of memory \n");
	else	printf(" error \n");
	fft2dFree();
}
printf(" Done. \n");
return;
}